

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.pb.cc
# Opt level: O1

void google::protobuf::Any::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  ulong uVar1;
  string *psVar2;
  Arena *pAVar3;
  string *psVar4;
  
  if (from_msg == to_msg) {
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    psVar2 = (string *)0x0;
  }
  if (psVar2 != (string *)0x0) {
    MergeImpl();
    return;
  }
  psVar4 = (string *)((ulong)from_msg[1]._vptr_MessageLite & 0xfffffffffffffffc);
  if (psVar4->_M_string_length != 0) {
    pAVar3 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar3 & 1) != 0) {
      pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set<>((ArenaStringPtr *)(to_msg + 1),psVar4,pAVar3);
  }
  psVar4 = (string *)(from_msg[1]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
  if (psVar4->_M_string_length != 0) {
    pAVar3 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar3 & 1) != 0) {
      pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set<>((ArenaStringPtr *)&to_msg[1]._internal_metadata_,psVar4,pAVar3);
  }
  uVar1 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar1 & 1) == 0) {
    return;
  }
  internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void Any::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<Any*>(&to_msg);
  auto& from = static_cast<const Any&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.Any)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (!from._internal_type_url().empty()) {
    _this->_internal_set_type_url(from._internal_type_url());
  }
  if (!from._internal_value().empty()) {
    _this->_internal_set_value(from._internal_value());
  }
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}